

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

BOOL Js::GlobalObject::MatchPatternHelper
               (JavascriptString *propertyName,JavascriptString *pattern,
               ScriptContext *scriptContext)

{
  char16 cVar1;
  charcount_t cVar2;
  charcount_t cVar3;
  uint idxStart_00;
  int iVar4;
  Var aValue;
  JavascriptString *__needle;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  charcount_t local_50;
  uint index;
  int idxEnd;
  int idxStart;
  JavascriptString *subPattern;
  BOOL bEnd;
  BOOL bStart;
  charcount_t nameLength;
  charcount_t patternLength;
  ScriptContext *scriptContext_local;
  JavascriptString *pattern_local;
  JavascriptString *propertyName_local;
  
  if ((propertyName == (JavascriptString *)0x0) || (pattern == (JavascriptString *)0x0)) {
    propertyName_local._4_4_ = 0;
  }
  else {
    cVar2 = JavascriptString::GetLength(pattern);
    cVar3 = JavascriptString::GetLength(propertyName);
    if (cVar2 == 0) {
      propertyName_local._4_4_ = 1;
    }
    else {
      cVar1 = JavascriptString::GetItem(pattern,0);
      bVar6 = cVar1 == L'*';
      cVar1 = JavascriptString::GetItem(pattern,cVar2 - 1);
      bVar7 = cVar1 == L'*';
      if ((bVar6) || (bVar7)) {
        idxStart_00 = (uint)bVar6;
        local_50 = cVar2;
        if (bVar7) {
          local_50 = cVar2 - 1;
        }
        if ((int)idxStart_00 < (int)local_50) {
          aValue = JavascriptString::SubstringCore
                             (pattern,idxStart_00,local_50 - idxStart_00,scriptContext);
          __needle = VarTo<Js::JavascriptString>(aValue);
          pcVar5 = JavascriptString::strstr((char *)propertyName,(char *)__needle);
          iVar4 = (int)pcVar5;
          if (iVar4 == -1) {
            propertyName_local._4_4_ = 0;
          }
          else if (bVar6) {
            if (bVar7) {
              propertyName_local._4_4_ = 1;
            }
            else {
              propertyName_local._4_4_ = (uint)((iVar4 + cVar2) - 1 == cVar3);
            }
          }
          else {
            propertyName_local._4_4_ = (uint)(iVar4 == 0);
          }
        }
        else {
          propertyName_local._4_4_ = 1;
        }
      }
      else {
        iVar4 = JavascriptString::strcmp((char *)propertyName,(char *)pattern);
        if (iVar4 == 0) {
          propertyName_local._4_4_ = 1;
        }
        else {
          propertyName_local._4_4_ = 0;
        }
      }
    }
  }
  return propertyName_local._4_4_;
}

Assistant:

BOOL GlobalObject::MatchPatternHelper(JavascriptString *propertyName, JavascriptString *pattern, ScriptContext *scriptContext)
    {
        if (nullptr == propertyName || nullptr == pattern)
        {
            return FALSE;
        }

        charcount_t     patternLength = pattern->GetLength();
        charcount_t     nameLength = propertyName->GetLength();
        BOOL    bStart;
        BOOL    bEnd;

        if (0 == patternLength)
        {
            return TRUE; // empty pattern matches all
        }

        bStart = (_u('*') == pattern->GetItem(0));// Is there a start star?
        bEnd = (_u('*') == pattern->GetItem(patternLength - 1));// Is there an end star?

        //deal with the stars
        if (bStart || bEnd)
        {
            JavascriptString *subPattern;
            int idxStart = bStart? 1: 0;
            int idxEnd   = bEnd? (patternLength - 1): patternLength;
            if (idxEnd <= idxStart)
            {
                return TRUE; //scenario double star **
            }

            //get a pattern which doesn't contain leading and trailing stars
            subPattern = VarTo<JavascriptString>(JavascriptString::SubstringCore(pattern, idxStart, idxEnd - idxStart, scriptContext));

            uint index = JavascriptString::strstr(propertyName, subPattern, false);

            if (index == (uint)-1)
            {
                return FALSE;
            }
            if (FALSE == bStart)
            {
                return index == 0; //begin at the same place;
            }
            else if (FALSE == bEnd)
            {
                return (index + patternLength - 1) == (nameLength);
            }
            return TRUE;
        }
        else
        {
            //full match
            if (0 == JavascriptString::strcmp(propertyName, pattern))
            {
                return TRUE;
            }
        }

        return FALSE;
    }